

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleFileMuxer.cpp
# Opt level: O2

int __thiscall SingleFileMuxer::close(SingleFileMuxer *this,int __fd)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  _Rb_tree_node_base *in_RAX;
  ostream *poVar4;
  undefined4 *puVar5;
  size_t __n;
  _Rb_tree_header *p_Var6;
  _Alloc_hider _Var7;
  _Base_ptr p_Var8;
  File *pFVar9;
  uint *local_1e0;
  undefined8 local_1d8;
  uint local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  string newName;
  ostringstream ss;
  
  _Var7._M_p = (pointer)(ulong)(uint)__fd;
  p_Var6 = &(this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->m_streamInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var8 != p_Var6) {
    pFVar9 = (File *)p_Var8[1]._M_parent;
    uVar2 = File::close(pFVar9,(int)_Var7._M_p);
    in_RAX = (_Rb_tree_node_base *)(ulong)uVar2;
    if ((char)uVar2 == '\0') break;
    if (0 < *(int *)((long)&pFVar9[2].super_AbstractOutputStream.super_AbstractStream.
                            _vptr_AbstractStream + 4)) {
      __n = 0;
      uVar2 = File::open(pFVar9,(char *)pFVar9[1].super_AbstractOutputStream.super_AbstractStream.
                                        _vptr_AbstractStream,6);
      in_RAX = (_Rb_tree_node_base *)(ulong)uVar2;
      if ((char)uVar2 == '\0') break;
      _Var7._M_p = (pointer)pFVar9[1].m_pos;
      in_RAX = (_Rb_tree_node_base *)
               File::write(pFVar9,(int)_Var7._M_p,
                           (void *)(ulong)*(uint *)((long)&pFVar9[2].super_AbstractOutputStream.
                                                           super_AbstractStream._vptr_AbstractStream
                                                   + 4),__n);
      if ((int)in_RAX == 0) break;
      plVar1 = (long *)pFVar9[2].m_name._M_dataplus._M_p;
      if (plVar1 != (long *)0x0) {
        _Var7._M_p = (pointer)pFVar9;
        in_RAX = (_Rb_tree_node_base *)(**(code **)(*plVar1 + 0x70))();
        if ((char)in_RAX == '\0') break;
      }
      uVar2 = File::close(pFVar9,(int)_Var7._M_p);
      in_RAX = (_Rb_tree_node_base *)(ulong)uVar2;
      if ((char)uVar2 == '\0') break;
      iVar3 = *(int *)&pFVar9[2].super_AbstractOutputStream.super_AbstractStream.
                       _vptr_AbstractStream;
      if (1 < iVar3) {
        pFVar9 = pFVar9 + 1;
        getNewName(&newName,(string *)pFVar9,iVar3);
        deleteFile(&newName);
        _Var7 = newName._M_dataplus;
        iVar3 = rename((char *)(pFVar9->super_AbstractOutputStream).super_AbstractStream.
                               _vptr_AbstractStream,newName._M_dataplus._M_p);
        if (iVar3 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          poVar4 = std::operator<<((ostream *)&ss,"Can\'t rename file ");
          poVar4 = std::operator<<(poVar4,(string *)pFVar9);
          poVar4 = std::operator<<(poVar4," to ");
          std::operator<<(poVar4,(string *)&newName);
          puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar5 = 3;
          *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
          if (local_1e0 == &local_1d0) {
            puVar5[6] = local_1d0;
            puVar5[7] = uStack_1cc;
            puVar5[8] = uStack_1c8;
            puVar5[9] = uStack_1c4;
          }
          else {
            *(uint **)(puVar5 + 2) = local_1e0;
            *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1cc,local_1d0);
          }
          *(undefined8 *)(puVar5 + 4) = local_1d8;
          local_1d0 = local_1d0 & 0xffffff00;
          __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        std::__cxx11::string::~string((string *)&newName);
      }
    }
    in_RAX = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    p_Var8 = in_RAX;
  }
  return (int)CONCAT71((int7)((ulong)in_RAX >> 8),(_Rb_tree_header *)p_Var8 == p_Var6);
}

Assistant:

bool SingleFileMuxer::close()
{
    for (const auto& [fst, snd] : m_streamInfo)
    {
        StreamInfo* streamInfo = snd;
        if (!streamInfo->m_file.close())
            return false;
        if (streamInfo->m_bufLen > 0)
        {
            if (!streamInfo->m_file.open(streamInfo->m_fileName.c_str(), File::ofWrite + File::ofAppend))
                return false;
            if (!streamInfo->m_file.write(streamInfo->m_buffer, streamInfo->m_bufLen))
                return false;
            if (streamInfo->m_codecReader)
                if (!streamInfo->m_codecReader->beforeFileCloseEvent(streamInfo->m_file))
                    return false;
            if (!streamInfo->m_file.close())
                return false;

            if (streamInfo->m_part > 1)
            {
                std::string newName = getNewName(streamInfo->m_fileName, streamInfo->m_part);
                deleteFile(newName);
                if (rename(streamInfo->m_fileName.c_str(), newName.c_str()) != 0)
                    THROW(ERR_COMMON, "Can't rename file " << streamInfo->m_fileName << " to " << newName)
            }
        }
    }
    return true;
}